

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O0

void strict_fstream::detail::static_method_holder::check_peek
               (istream *is_p,string *filename,openmode mode)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int __errnum;
  long *in_RDI;
  failure *anon_var_0;
  bool peek_failed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 uVar2;
  strict_fstream local_138 [4];
  openmode in_stack_fffffffffffffecc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined1 local_f1 [97];
  undefined1 local_90 [123];
  byte local_15;
  long *local_8;
  
  local_15 = 1;
  local_8 = in_RDI;
  std::istream::peek();
  bVar1 = std::ios::fail();
  local_15 = bVar1 & 1;
  if (local_15 != 0) {
    uVar2 = 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_f1 + 1),"strict_fstream: open(\'",(allocator *)__lhs);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    mode_to_string_abi_cxx11_(in_stack_fffffffffffffecc);
    std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    __errnum = (int)local_90;
    std::operator+(__lhs,(char *)__rhs);
    strerror_abi_cxx11_(local_138,__errnum);
    std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    Exception::Exception
              ((Exception *)CONCAT17(uVar2,CONCAT16(bVar1,in_stack_fffffffffffffec0)),__lhs);
    __cxa_throw(__rhs,&Exception::typeinfo,Exception::~Exception);
  }
  std::ios::clear((int)local_8 + (int)*(undefined8 *)(*local_8 + -0x18));
  return;
}

Assistant:

static void check_peek(std::istream * is_p, const std::string& filename, std::ios_base::openmode mode)
    {
        bool peek_failed = true;
        try
        {
            is_p->peek();
            peek_failed = is_p->fail();
        }
        catch (const std::ios_base::failure &) {}
        if (peek_failed)
        {
            throw Exception(std::string("strict_fstream: open('")
                            + filename + "'," + mode_to_string(mode) + "): peek failed: "
                            + strerror());
        }
        is_p->clear();
    }